

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O0

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  uint flags_local;
  sockaddr *addr_local;
  uv_buf_t *rcvbuf_local;
  ssize_t nread_local;
  uv_udp_t *handle_local;
  
  if (nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
            ,0x3f,"nread > 0");
    abort();
  }
  if (nread == 0) {
    if (addr != (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
              ,0x42,"addr","==","NULL",addr,"==",0);
      abort();
    }
  }
  else {
    if (nread != 4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
              ,0x46,"nread == 4");
      abort();
    }
    if (addr == (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
              ,0x47,"addr","!=","NULL",0,"!=",0);
      abort();
    }
    iVar1 = memcmp("EXIT",rcvbuf->base,4);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
              ,0x49,"memcmp(\"EXIT\", rcvbuf->base, nread) == 0");
      abort();
    }
    uv_close(handle,close_cb);
    uv_close(&client,close_cb);
    sv_recv_cb_called = sv_recv_cb_called + 1;
  }
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  if (nread > 0) {
    ASSERT(nread == 4);
    ASSERT_NOT_NULL(addr);
    ASSERT(memcmp("EXIT", rcvbuf->base, nread) == 0);
    if (++sv_recv_cb_called == 4) {
      uv_close((uv_handle_t*) &server, close_cb);
      uv_close((uv_handle_t*) &client, close_cb);
    }
  }
}